

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::shaderexecutor::
InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::createInstance(InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,Context *context)

{
  int iVar1;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_3>_>_>
  *this_00;
  undefined4 extraout_var;
  SharedPtr<const_vkt::shaderexecutor::Statement> local_110;
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_3>_>_>
  local_100;
  CaseContext local_a0;
  
  this_00 = (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_3>_>_>
             *)operator_new(0x120);
  CaseContext::CaseContext(&local_a0,&(this->super_FuncCaseBase).super_PrecisionCase.m_ctx);
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_3>_>_>
  ::Variables(&local_100,&this->m_variables);
  iVar1 = (*(this->super_FuncCaseBase).super_PrecisionCase.super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[7])(this);
  local_110.m_ptr =
       (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr
  ;
  local_110.m_state =
       (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.
       m_state;
  if (local_110.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_110.m_state)->strongRefCount = (local_110.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_110.m_state)->weakRefCount = (local_110.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_3>_>_>
  ::BuiltinPrecisionCaseTestInstance
            (this_00,context,&local_a0,&(this->super_FuncCaseBase).super_PrecisionCase.m_spec,
             &local_100,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)CONCAT44(extraout_var,iVar1),(StatementP *)&local_110);
  de::SharedPtr<const_vkt::shaderexecutor::Statement>::~SharedPtr(&local_110);
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_3>_>_>
  ::~Variables(&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance	(Context& context) const
	{
		return new BuiltinPrecisionCaseTestInstance<In, Out>(context, m_ctx, m_spec, m_variables, getSamplings(), m_stmt);
	}